

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

bool gguf_read_emplace_helper<double>
               (gguf_reader *gr,vector<gguf_kv,_std::allocator<gguf_kv>_> *kv,string *key,
               bool is_array,size_t n)

{
  bool bVar1;
  size_t sVar2;
  undefined7 in_register_00000009;
  vector<double,_std::allocator<double>_> value;
  vector<double,_std::allocator<double>_> local_38;
  
  if ((int)CONCAT71(in_register_00000009,is_array) == 0) {
    sVar2 = fread(&local_38,1,8,(FILE *)gr->file);
    if (sVar2 != 8) {
      return false;
    }
    std::vector<gguf_kv,std::allocator<gguf_kv>>::emplace_back<std::__cxx11::string_const&,double&>
              ((vector<gguf_kv,std::allocator<gguf_kv>> *)kv,key,(double *)&local_38);
  }
  else {
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = gguf_reader::read<double>(gr,&local_38,n);
    if (bVar1) {
      std::vector<gguf_kv,std::allocator<gguf_kv>>::
      emplace_back<std::__cxx11::string_const&,std::vector<double,std::allocator<double>>&>
                ((vector<gguf_kv,std::allocator<gguf_kv>> *)kv,key,&local_38);
    }
    if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool gguf_read_emplace_helper(const struct gguf_reader & gr, std::vector<struct gguf_kv> & kv, const std::string & key, const bool is_array, const size_t n) {
    if (is_array) {
        std::vector<T> value;
        try {
            if (!gr.read(value, n)) {
                return false;
            }
        } catch (std::length_error &) {
            fprintf(stderr, "%s: encountered length_error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        } catch (std::bad_alloc &) {
            fprintf(stderr, "%s: encountered bad_alloc error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        }
        kv.emplace_back(key, value);
    } else {
        T value;
        if (!gr.read(value)) {
            return false;
        }
        kv.emplace_back(key, value);
    }
    return true;
}